

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

char * Qiniu_escape(char *s,escapeMode mode,Qiniu_Bool *fesc)

{
  byte bVar1;
  int iVar2;
  uint c_00;
  size_t sVar3;
  char *t;
  int c;
  size_t len;
  size_t j;
  size_t i;
  int hexCount;
  int spaceCount;
  Qiniu_Bool *fesc_local;
  escapeMode mode_local;
  char *s_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  sVar3 = strlen(s);
  for (j = 0; j < sVar3; j = j + 1) {
    bVar1 = s[j];
    iVar2 = Qiniu_shouldEscape((uint)bVar1,mode);
    if (iVar2 != 0) {
      if ((bVar1 == 0x20) && (mode == encodeQueryComponent)) {
        i._4_4_ = i._4_4_ + 1;
      }
      else {
        i._0_4_ = (int)i + 1;
      }
    }
  }
  if ((i._4_4_ == 0) && ((int)i == 0)) {
    *fesc = 0;
    s_local = s;
  }
  else {
    s_local = (char *)malloc(sVar3 + (long)((int)i << 1) + 1);
    len = 0;
    for (j = 0; j < sVar3; j = j + 1) {
      c_00 = (uint)(byte)s[j];
      iVar2 = Qiniu_shouldEscape(c_00,mode);
      if (iVar2 == 0) {
        s_local[len] = s[j];
        len = len + 1;
      }
      else if ((c_00 == 0x20) && (mode == encodeQueryComponent)) {
        s_local[len] = '+';
        len = len + 1;
      }
      else {
        s_local[len] = '%';
        s_local[len + 1] = "0123456789ABCDEF"[(int)c_00 >> 4];
        s_local[len + 2] = "0123456789ABCDEF"[(int)(c_00 & 0xf)];
        len = len + 3;
      }
    }
    s_local[len] = '\0';
    *fesc = 1;
  }
  return s_local;
}

Assistant:

static char *Qiniu_escape(const char *s, escapeMode mode, Qiniu_Bool *fesc)
{
	int spaceCount = 0;
	int hexCount = 0;
	size_t i, j, len = strlen(s);
	int c;
	char *t;

	for (i = 0; i < len; i++)
	{
		// prevent c from sign extension
		c = ((int)s[i]) & 0xFF;
		if (Qiniu_shouldEscape(c, mode))
		{
			if (c == ' ' && mode == encodeQueryComponent)
			{
				spaceCount++;
			}
			else
			{
				hexCount++;
			}
		}
	}

	if (spaceCount == 0 && hexCount == 0)
	{
		*fesc = Qiniu_False;
		return (char *)s;
	}

	t = (char *)malloc(len + 2 * hexCount + 1);
	j = 0;
	for (i = 0; i < len; i++)
	{
		// prevent c from sign extension
		c = ((int)s[i]) & 0xFF;
		if (Qiniu_shouldEscape(c, mode))
		{
			if (c == ' ' && mode == encodeQueryComponent)
			{
				t[j] = '+';
				j++;
			}
			else
			{
				t[j] = '%';
				t[j + 1] = Qiniu_hexTable[c >> 4];
				t[j + 2] = Qiniu_hexTable[c & 15];
				j += 3;
			}
		}
		else
		{
			t[j] = s[i];
			j++;
		}
	}
	t[j] = '\0';
	*fesc = Qiniu_True;
	return t;
}